

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::StringToNumber<unsigned_long>(char *str,uint64_t *val)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  
  bVar4 = false;
  bVar2 = StringToIntegerImpl<unsigned_long>(val,str,0,true);
  if ((bVar2) && (bVar4 = true, *val != 0)) {
    pcVar3 = str + -1;
    do {
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
      if (*pcVar1 == '\0') break;
    } while (9 < (int)*pcVar1 - 0x30U);
    if (pcVar3[-(ulong)(str < pcVar3)] == '-') {
      *val = 0xffffffffffffffff;
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

inline bool StringToNumber<uint64_t>(const char *str, uint64_t *val) {
  if (!StringToIntegerImpl(val, str)) return false;
  // The strtoull accepts negative numbers:
  // If the minus sign was part of the input sequence, the numeric value
  // calculated from the sequence of digits is negated as if by unary minus
  // in the result type, which applies unsigned integer wraparound rules.
  // Fix this behaviour (except -0).
  if (*val) {
    auto s = str;
    while (*s && !is_digit(*s)) s++;
    s = (s > str) ? (s - 1) : s;  // step back to one symbol
    if (*s == '-') {
      // For unsigned types return the max to distinguish from
      // "no conversion can be performed".
      *val = (flatbuffers::numeric_limits<uint64_t>::max)();
      return false;
    }
  }
  return true;
}